

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_h_predictor_4x16_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  long lVar1;
  undefined1 auVar2 [16];
  
  lVar1 = 0;
  do {
    auVar2 = pshuflw(ZEXT216(left[lVar1]),ZEXT216(left[lVar1]),0);
    *(long *)dst = auVar2._0_8_;
    lVar1 = lVar1 + 1;
    dst = dst + stride;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

static inline void highbd_h_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)above;
  (void)bd;
  for (r = 0; r < bh; r++) {
    aom_memset16(dst, left[r], bw);
    dst += stride;
  }
}